

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_add_elements_raw_input_at
              (wally_tx *tx,uint32_t index,uchar *txhash,size_t txhash_len,uint32_t utxo_index,
              uint32_t sequence,uchar *script,size_t script_len,wally_tx_witness_stack *witness,
              uchar *nonce,size_t nonce_len,uchar *entropy,size_t entropy_len,uchar *issuance_amount
              ,size_t issuance_amount_len,uchar *inflation_keys,size_t inflation_keys_len,
              uchar *issuance_amount_rangeproof,size_t issuance_amount_rangeproof_len,
              uchar *inflation_keys_rangeproof,size_t inflation_keys_rangeproof_len,
              wally_tx_witness_stack *pegin_witness,uint32_t flags)

{
  int iVar1;
  
  iVar1 = tx_add_elements_raw_input_at
                    (tx,index,txhash,txhash_len,utxo_index,sequence,script,script_len,witness,nonce,
                     nonce_len,entropy,entropy_len,issuance_amount,issuance_amount_len,
                     inflation_keys,inflation_keys_len,issuance_amount_rangeproof,
                     issuance_amount_rangeproof_len,inflation_keys_rangeproof,
                     inflation_keys_rangeproof_len,pegin_witness,flags,true);
  return iVar1;
}

Assistant:

int wally_tx_add_elements_raw_input_at(
    struct wally_tx *tx, uint32_t index,
    const unsigned char *txhash, size_t txhash_len,
    uint32_t utxo_index, uint32_t sequence,
    const unsigned char *script, size_t script_len,
    const struct wally_tx_witness_stack *witness,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *entropy, size_t entropy_len,
    const unsigned char *issuance_amount, size_t issuance_amount_len,
    const unsigned char *inflation_keys, size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof, size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof, size_t inflation_keys_rangeproof_len,
    const struct wally_tx_witness_stack *pegin_witness, uint32_t flags)
{
    return tx_add_elements_raw_input_at(
        tx, index, txhash, txhash_len,
        utxo_index, sequence, script,
        script_len, witness,
        nonce, nonce_len, entropy, entropy_len,
        issuance_amount, issuance_amount_len,
        inflation_keys, inflation_keys_len,
        issuance_amount_rangeproof, issuance_amount_rangeproof_len,
        inflation_keys_rangeproof, inflation_keys_rangeproof_len,
        pegin_witness, flags, true);
}